

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O0

Am_Constraint * __thiscall
Animation_Constraint::Constraint_Added(Animation_Constraint *this,Am_Slot *adding_slot)

{
  bool bVar1;
  Am_Slot_Data *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Value *pAVar4;
  Am_Value_List *list;
  Am_Slot local_78;
  Am_Value_List local_70;
  Am_Slot local_60;
  undefined1 local_58 [8];
  Am_Value_List slots;
  Am_Demon_Queue queue;
  Am_Object_Advanced object;
  Am_Object local_28;
  Am_Slot_Key local_1a;
  Am_Slot *pAStack_18;
  Am_Slot_Key key;
  Am_Slot *adding_slot_local;
  Animation_Constraint *this_local;
  
  pAStack_18 = adding_slot;
  adding_slot_local = (Am_Slot *)this;
  local_1a = Am_Slot::Get_Key(adding_slot);
  pAVar2 = Am_Slot::operator_cast_to_Am_Slot_Data_(&this->primary_slot);
  if (pAVar2 == (Am_Slot_Data *)0x0) {
    (this->primary_slot).data = pAStack_18->data;
    Am_Slot::Get_Owner((Am_Slot *)&local_28);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
    Am_Object::Set(&(this->interpolator).super_Am_Object,0x193,pAVar3,0);
    Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_28);
    if ((this->multi_slot & 1U) == 0) {
      Am_Object::Set(&(this->interpolator).super_Am_Object,0xeb,(uint)local_1a,0);
    }
    else {
      Am_Slot::Get_Owner((Am_Slot *)&queue);
      Am_Object_Advanced::Get_Queue((Am_Object_Advanced *)&slots.item);
      Am_Demon_Queue::Enqueue
                ((Am_Demon_Queue *)&slots.item,animator_initialize_demon,0,&this->primary_slot);
      this->must_initialize_instance = true;
      Am_Demon_Queue::~Am_Demon_Queue((Am_Demon_Queue *)&slots.item);
      Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&queue);
    }
  }
  else {
    Am_Value_List::Am_Value_List((Am_Value_List *)local_58);
    if ((this->must_initialize_instance & 1U) != 0) {
      Initialize(this);
    }
    if ((this->multi_slot & 1U) == 0) {
      Am_Value_List::Am_Value_List(&local_70);
      local_78 = Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar4 = Am_Slot::Get(&local_78);
      list = Am_Value_List::Add(&local_70,pAVar4,Am_TAIL,true);
      Am_Value_List::operator=((Am_Value_List *)local_58,list);
      Am_Value_List::~Am_Value_List(&local_70);
      this->multi_slot = true;
    }
    else {
      local_60 = Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar4 = Am_Slot::Get(&local_60);
      Am_Value_List::operator=((Am_Value_List *)local_58,pAVar4);
    }
    Am_Value_List::Start((Am_Value_List *)local_58);
    bVar1 = Am_Value_List::Member((Am_Value_List *)local_58,(uint)local_1a);
    if (!bVar1) {
      Am_Value_List::Add((Am_Value_List *)local_58,(uint)local_1a,Am_TAIL,true);
    }
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_58);
    Am_Object::Set(&(this->interpolator).super_Am_Object,0xeb,pAVar3,0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_58);
  }
  Init_Target_Value(this,pAStack_18);
  Am_Value::operator=(&this->start,&this->target);
  Am_Slot::Add_Dependency(pAStack_18,&this->super_Am_Constraint);
  Am_Slot::Invalidate(pAStack_18,&this->super_Am_Constraint);
  return &this->super_Am_Constraint;
}

Assistant:

Am_Constraint *
Animation_Constraint::Constraint_Added(const Am_Slot &adding_slot)
{
  Am_Slot_Key key = (int)adding_slot.Get_Key();

  if (!(Am_Slot_Data *)primary_slot) {
    primary_slot = adding_slot;

    // Make sure interpolator has a handle to the object it's animating.
    interpolator.Set(Am_OPERATES_ON, primary_slot.Get_Owner());

    if (multi_slot) {
      // queue up a demon to connect this new instance to the other
      // slots it should animate
      Am_Object_Advanced object = primary_slot.Get_Owner();
      Am_Demon_Queue queue = object.Get_Queue();
      queue.Enqueue(animator_initialize_demon, 0, primary_slot);
      // The which_bit parameter for Enqueue is zero so that when the demon is
      // called it won't affect the demon_bits in the slot.

      must_initialize_instance = true;
    } else
      interpolator.Set(Am_SLOT_TO_ANIMATE, key);
  } else {
    Am_Value_List slots;

    if (must_initialize_instance)
      Initialize();

    if (multi_slot) {
      // already a multi-slot constraint
      slots = interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    } else {
      // convert to multi-slot constraint
      slots =
          Am_Value_List().Add(interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get());
      multi_slot = true;
    }

    // add the slot to the SLOT_TO_ANIMATE list if it isn't already present
    slots.Start();
    if (!slots.Member(key))
    slots.Add((int)key);

    interpolator.Set(Am_SLOT_TO_ANIMATE, slots);
  }

  Init_Target_Value(adding_slot);
  start = target;

  adding_slot.Add_Dependency(this);
  ((Am_Slot *)(&adding_slot))->Invalidate(this);
  return this;
}